

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O3

_Bool AES_CCM_Encrypt(COSE_Enveloped *pcose,int TSize,int LSize,byte *pbKey,size_t cbKey,
                     byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  size_t length;
  _Bool _Var1;
  int iVar2;
  cose_error cVar3;
  cn_cbor *pcVar4;
  cn_cbor *pcVar5;
  _Bool _Var6;
  int iVar7;
  size_t __nmemb;
  cn_cbor_errback cbor_error;
  byte rgbIV [16];
  mbedtls_ccm_context ctx;
  
  iVar7 = LSize + 7;
  if (-1 < LSize) {
    iVar7 = LSize;
  }
  iVar7 = 0xf - (iVar7 >> 3);
  mbedtls_ccm_init(&ctx);
  pcVar4 = _COSE_map_get_int(&pcose->m_message,5,7,perr);
  if (pcVar4 == (cn_cbor *)0x0) {
    __nmemb = (size_t)iVar7;
    pcVar4 = (cn_cbor *)calloc(__nmemb,1);
    if (pcVar4 == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
    }
    else {
      rand_bytes((byte *)pcVar4,__nmemb);
      memcpy(rgbIV,pcVar4,__nmemb);
      pcVar5 = cn_cbor_data_create((uint8_t *)pcVar4,iVar7,&cbor_error);
      if (pcVar5 == (cn_cbor *)0x0) {
        if (perr != (cose_errback *)0x0) {
          cVar3 = _MapFromCBOR(cbor_error);
          perr->err = cVar3;
        }
      }
      else {
        _Var1 = _COSE_map_put(&pcose->m_message,5,pcVar5,2,perr);
        pcVar4 = pcVar5;
        if (_Var1) goto LAB_001977d2;
      }
LAB_001978c3:
      free(pcVar4);
    }
  }
  else if ((pcVar4->type == CN_CBOR_BYTES) && (pcVar4->length == iVar7)) {
    memcpy(rgbIV,(pcVar4->v).bytes,(long)iVar7);
LAB_001977d2:
    iVar2 = mbedtls_ccm_setkey(&ctx,MBEDTLS_CIPHER_ID_AES,pbKey,(int)cbKey << 3);
    if (iVar2 == 0) {
      iVar2 = TSize + 7;
      if (-1 < TSize) {
        iVar2 = TSize;
      }
      iVar2 = iVar2 >> 3;
      length = pcose->cbContent;
      pcVar4 = (cn_cbor *)calloc((long)((int)length + iVar2),1);
      if (pcVar4 != (cn_cbor *)0x0) {
        iVar7 = mbedtls_ccm_encrypt_and_tag
                          (&ctx,length,rgbIV,(long)iVar7,pbAuthData,cbAuthData,pcose->pbContent,
                           (uchar *)pcVar4,(uchar *)((long)&pcVar4->type + length),(long)iVar2);
        if (iVar7 == 0) {
          pcVar5 = cn_cbor_data_create((uint8_t *)pcVar4,iVar2 + (int)pcose->cbContent,
                                       (cn_cbor_errback *)0x0);
          if (pcVar5 != (cn_cbor *)0x0) {
            _Var1 = _COSE_array_replace(&pcose->m_message,pcVar5,2,(cn_cbor_errback *)0x0);
            _Var6 = true;
            if (_Var1) goto LAB_001978ca;
            pcVar4 = pcVar5;
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_CBOR;
            }
            goto LAB_001978c3;
          }
          cVar3 = COSE_ERR_CBOR;
        }
        else {
          cVar3 = COSE_ERR_CRYPTO_FAIL;
        }
        if (perr != (cose_errback *)0x0) {
          perr->err = cVar3;
        }
        goto LAB_001978c3;
      }
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_OUT_OF_MEMORY;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_CRYPTO_FAIL;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_PARAMETER;
  }
  _Var6 = false;
LAB_001978ca:
  mbedtls_ccm_free(&ctx);
  return _Var6;
}

Assistant:

bool AES_CCM_Encrypt(COSE_Enveloped * pcose, int TSize, int LSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_ccm_context ctx;
	int cbOut;
	byte * rgbOut = NULL;
	int NSize = 15 - (LSize/8);
	const cn_cbor * cbor_iv = NULL;
	cn_cbor * cbor_iv_t = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif
	cn_cbor * cnTmp = NULL;
	mbedtls_cipher_id_t cipher;
	byte rgbIV[16];
	byte * pbIV = NULL;
	cn_cbor_errback cbor_error;

        mbedtls_ccm_init(&ctx);

	cipher = MBEDTLS_CIPHER_ID_AES;			
	
	//  Setup the IV/Nonce and put it into the message
	cbor_iv = _COSE_map_get_int(&pcose->m_message, COSE_Header_IV, COSE_BOTH, perr);
	if (cbor_iv == NULL) {
	
                pbIV = COSE_CALLOC(NSize, 1, context);
		CHECK_CONDITION(pbIV != NULL, COSE_ERR_OUT_OF_MEMORY);
		rand_bytes(pbIV, NSize);
		memcpy(rgbIV, pbIV, NSize);
		cbor_iv_t = cn_cbor_data_create(pbIV, NSize, CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(cbor_iv_t != NULL, cbor_error);
		pbIV = NULL;

		if (!_COSE_map_put(&pcose->m_message, COSE_Header_IV, cbor_iv_t, COSE_UNPROTECT_ONLY, perr)) goto errorReturn;
		cbor_iv_t = NULL;
	}
	else {
		CHECK_CONDITION(cbor_iv->type == CN_CBOR_BYTES, COSE_ERR_INVALID_PARAMETER);
		CHECK_CONDITION(cbor_iv->length == NSize, COSE_ERR_INVALID_PARAMETER);
		memcpy(rgbIV, cbor_iv->v.str, cbor_iv->length);
	}

	//  Setup and run the mbedTLS code
	
	//cbKey comes in bytes not bits
 	CHECK_CONDITION(!mbedtls_ccm_setkey(&ctx, cipher, pbKey, cbKey*8), COSE_ERR_CRYPTO_FAIL);
	
	TSize /= 8; // Comes in in bits not bytes.

        cbOut = pcose->cbContent; // M00BUG - This is a missing call?
	rgbOut = (byte *)COSE_CALLOC(cbOut+TSize, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!mbedtls_ccm_encrypt_and_tag(&ctx, pcose->cbContent, rgbIV, NSize, pbAuthData, cbAuthData, pcose->pbContent, rgbOut, &rgbOut[pcose->cbContent], TSize), COSE_ERR_CRYPTO_FAIL);	

	cnTmp = cn_cbor_data_create(rgbOut, (int)pcose->cbContent + TSize, CBOR_CONTEXT_PARAM_COMMA NULL);
	CHECK_CONDITION(cnTmp != NULL, COSE_ERR_CBOR);
	rgbOut = NULL;

	CHECK_CONDITION(_COSE_array_replace(&pcose->m_message, cnTmp, INDEX_BODY, CBOR_CONTEXT_PARAM_COMMA NULL), COSE_ERR_CBOR);
	cnTmp = NULL;

	mbedtls_ccm_free(&ctx);
	
	return true;

errorReturn:
	if (pbIV != NULL) COSE_FREE(pbIV, context);
	if (cbor_iv_t != NULL) COSE_FREE(cbor_iv_t, context);
	if (rgbOut != NULL) COSE_FREE(rgbOut, context);
	if (cnTmp != NULL) COSE_FREE(cnTmp, context);
	mbedtls_ccm_free(&ctx);
	return false;
}